

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O0

int dynamicSeek(gdIOCtx *ctx,int pos)

{
  dynamicPtr *dp_00;
  int iVar1;
  dpIOCtx *dctx;
  dynamicPtr *dp;
  int bytesNeeded;
  int pos_local;
  gdIOCtx *ctx_local;
  
  if (pos < 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    dp_00 = (dynamicPtr *)ctx[1].getC;
    if (dp_00->dataGood == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      if (dp_00->realSize < pos) {
        if (dp_00->freeOK == 0) {
          return 0;
        }
        iVar1 = overflow2(dp_00->realSize,2);
        if (iVar1 != 0) {
          return 0;
        }
        iVar1 = gdReallocDynamic(dp_00,dp_00->realSize << 1);
        if (iVar1 == 0) {
          dp_00->dataGood = 0;
          return 0;
        }
      }
      if (dp_00->logicalSize < pos) {
        dp_00->logicalSize = pos;
      }
      dp_00->pos = pos;
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int dynamicSeek(struct gdIOCtx *ctx, const int pos)
{
	int bytesNeeded;
	dynamicPtr *dp;
	dpIOCtx *dctx;

	if (pos < 0) {
		return FALSE;
	}
	dctx = (dpIOCtx *)ctx;
	dp = dctx->dp;

	if(!dp->dataGood) {
		return FALSE;
	}

	bytesNeeded = pos;
	if(bytesNeeded > dp->realSize) {
		/* 2.0.21 */
		if(!dp->freeOK) {
			return FALSE;
		}

		if(overflow2(dp->realSize, 2)) {
			return FALSE;
		}

		if(!gdReallocDynamic(dp, dp->realSize * 2)) {
			dp->dataGood = FALSE;
			return FALSE;
		}
	}

	/* if we get here, we can be sure that we have enough bytes
	 * to copy safely */

	/* Extend the logical size if we seek beyond EOF. */
	if(pos > dp->logicalSize) {
		dp->logicalSize = pos;
	};

	dp->pos = pos;

	return TRUE;
}